

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode Curl_readrewind(Curl_easy *data)

{
  connectdata *pcVar1;
  HTTP *pHVar2;
  CURLcode CVar3;
  uint uVar4;
  curlioerr cVar5;
  int iVar6;
  curlioerr err_1;
  int err;
  CURLcode result;
  HTTP *http;
  curl_mimepart *mimepart;
  connectdata *conn;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  http = (HTTP *)&(data->set).mimepost;
  *(uint *)&(pcVar1->bits).field_0x4 = *(uint *)&(pcVar1->bits).field_0x4 & 0xfffdffff;
  (data->req).keepon = (data->req).keepon & 0xfffffffd;
  if (((pcVar1->handler->protocol & 3) != 0) &&
     (pHVar2 = (data->req).p.http, pHVar2->sendit != (curl_mimepart *)0x0)) {
    http = (HTTP *)pHVar2->sendit;
  }
  if ((data->set).postfields == (void *)0x0) {
    if (((data->state).httpreq == '\x03') || ((data->state).httpreq == '\x02')) {
      CVar3 = Curl_mime_rewind((curl_mimepart *)http);
      if (CVar3 != CURLE_OK) {
        Curl_failf(data,"Cannot rewind mime/post data");
        return CVar3;
      }
    }
    else if ((data->set).seek_func == (curl_seek_callback)0x0) {
      if ((data->set).ioctl_func == (curl_ioctl_callback)0x0) {
        if (((data->state).fread_func == fread) &&
           (iVar6 = fseek((FILE *)(data->state).in,0,0), iVar6 != -1)) {
          return CURLE_OK;
        }
        Curl_failf(data,"necessary data rewind wasn\'t possible");
        return CURLE_SEND_FAIL_REWIND;
      }
      Curl_set_in_callback(data,true);
      cVar5 = (*(data->set).ioctl_func)(data,1,(data->set).ioctl_client);
      Curl_set_in_callback(data,false);
      Curl_infof(data,"the ioctl callback returned %d",(ulong)cVar5);
      if (cVar5 != CURLIOE_OK) {
        Curl_failf(data,"ioctl callback returned error %d",(ulong)cVar5);
        return CURLE_SEND_FAIL_REWIND;
      }
    }
    else {
      Curl_set_in_callback(data,true);
      uVar4 = (*(data->set).seek_func)((data->set).seek_client,0,0);
      Curl_set_in_callback(data,false);
      if (uVar4 != 0) {
        Curl_failf(data,"seek callback returned error %d",(ulong)uVar4);
        return CURLE_SEND_FAIL_REWIND;
      }
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_readrewind(struct Curl_easy *data)
{
  struct connectdata *conn = data->conn;
  curl_mimepart *mimepart = &data->set.mimepost;

  conn->bits.rewindaftersend = FALSE; /* we rewind now */

  /* explicitly switch off sending data on this connection now since we are
     about to restart a new transfer and thus we want to avoid inadvertently
     sending more data on the existing connection until the next transfer
     starts */
  data->req.keepon &= ~KEEP_SEND;

  /* We have sent away data. If not using CURLOPT_POSTFIELDS or
     CURLOPT_HTTPPOST, call app to rewind
  */
  if(conn->handler->protocol & PROTO_FAMILY_HTTP) {
    struct HTTP *http = data->req.p.http;

    if(http->sendit)
      mimepart = http->sendit;
  }
  if(data->set.postfields)
    ; /* do nothing */
  else if(data->state.httpreq == HTTPREQ_POST_MIME ||
          data->state.httpreq == HTTPREQ_POST_FORM) {
    CURLcode result = Curl_mime_rewind(mimepart);
    if(result) {
      failf(data, "Cannot rewind mime/post data");
      return result;
    }
  }
  else {
    if(data->set.seek_func) {
      int err;

      Curl_set_in_callback(data, true);
      err = (data->set.seek_func)(data->set.seek_client, 0, SEEK_SET);
      Curl_set_in_callback(data, false);
      if(err) {
        failf(data, "seek callback returned error %d", (int)err);
        return CURLE_SEND_FAIL_REWIND;
      }
    }
    else if(data->set.ioctl_func) {
      curlioerr err;

      Curl_set_in_callback(data, true);
      err = (data->set.ioctl_func)(data, CURLIOCMD_RESTARTREAD,
                                   data->set.ioctl_client);
      Curl_set_in_callback(data, false);
      infof(data, "the ioctl callback returned %d", (int)err);

      if(err) {
        failf(data, "ioctl callback returned error %d", (int)err);
        return CURLE_SEND_FAIL_REWIND;
      }
    }
    else {
      /* If no CURLOPT_READFUNCTION is used, we know that we operate on a
         given FILE * stream and we can actually attempt to rewind that
         ourselves with fseek() */
      if(data->state.fread_func == (curl_read_callback)fread) {
        if(-1 != fseek(data->state.in, 0, SEEK_SET))
          /* successful rewind */
          return CURLE_OK;
      }

      /* no callback set or failure above, makes us fail at once */
      failf(data, "necessary data rewind wasn't possible");
      return CURLE_SEND_FAIL_REWIND;
    }
  }
  return CURLE_OK;
}